

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O2

DWARFDie __thiscall llvm::DWARFUnit::getParent(DWARFUnit *this,DWARFDebugInfoEntry *Die)

{
  uint32_t uVar1;
  pointer pDVar2;
  uint32_t uVar3;
  DWARFDie DVar4;
  
  if ((Die == (DWARFDebugInfoEntry *)0x0) || (uVar1 = Die->Depth, uVar1 == 0)) {
    DVar4 = (DWARFDie)ZEXT816(0);
  }
  else if (uVar1 == 1) {
    DVar4 = getUnitDIE(this,true);
  }
  else {
    uVar3 = getDIEIndex(this,Die);
    pDVar2 = (this->DieArray).
             super__Vector_base<llvm::DWARFDebugInfoEntry,_std::allocator<llvm::DWARFDebugInfoEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar3 = uVar3 - 1;
      if (uVar3 == 0) {
        return (DWARFDie)ZEXT816(0);
      }
    } while (pDVar2[uVar3].Depth != uVar1 - 1);
    DVar4.Die = pDVar2 + uVar3;
    DVar4.U = this;
  }
  return DVar4;
}

Assistant:

DWARFDie DWARFUnit::getParent(const DWARFDebugInfoEntry *Die) {
  if (!Die)
    return DWARFDie();
  const uint32_t Depth = Die->getDepth();
  // Unit DIEs always have a depth of zero and never have parents.
  if (Depth == 0)
    return DWARFDie();
  // Depth of 1 always means parent is the compile/type unit.
  if (Depth == 1)
    return getUnitDIE();
  // Look for previous DIE with a depth that is one less than the Die's depth.
  const uint32_t ParentDepth = Depth - 1;
  for (uint32_t I = getDIEIndex(Die) - 1; I > 0; --I) {
    if (DieArray[I].getDepth() == ParentDepth)
      return DWARFDie(this, &DieArray[I]);
  }
  return DWARFDie();
}